

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O3

size_t qHash(QCborMap *map,size_t seed)

{
  QCborContainerPrivate *pQVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QCborValueConstRef local_58;
  QCborValueConstRef local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (map->d).d.ptr;
  if ((pQVar1 != (QCborContainerPrivate *)0x0) && (uVar2 = (pQVar1->elements).d.size, 1 < uVar2)) {
    uVar5 = 1;
    do {
      local_58.i = uVar5 - 1;
      local_58.d = pQVar1;
      local_48.d = pQVar1;
      local_48.i = uVar5;
      sVar3 = qHash<QCborValueConstRef,_true>(&local_58,0);
      uVar4 = sVar3 + 0x9e3779b9;
      sVar3 = qHash<QCborValueConstRef,_true>(&local_48,0);
      seed = seed ^ seed * 0x40 + 0x9e3779b9 + (seed >> 2) +
                    ((uVar4 >> 2) + uVar4 * 0x40 + sVar3 + 0x9e3779b9 ^ uVar4);
      uVar5 = uVar5 + 2;
    } while ((uVar2 | 1) != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return seed;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QCborMap &map, size_t seed)
{
    return qHashRange(map.begin(), map.end(), seed);
}